

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O2

void __thiscall Liby::TimerMixin::TimerMixin(TimerMixin *this)

{
  EventLoop *pEVar1;
  
  this->_vptr_TimerMixin = (_func_int **)&PTR__TimerMixin_001323e0;
  (this->timerHolders_)._M_h._M_buckets = &(this->timerHolders_)._M_h._M_single_bucket;
  (this->timerHolders_)._M_h._M_bucket_count = 1;
  (this->timerHolders_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->timerHolders_)._M_h._M_element_count = 0;
  (this->timerHolders_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->timerHolders_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->timerHolders_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pEVar1 = EventLoop::curr_thread_loop();
  this->loop_ = pEVar1;
  return;
}

Assistant:

TimerMixin::TimerMixin() { loop_ = EventLoop::curr_thread_loop(); }